

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O2

int32_t __thiscall
icu_63::number::impl::NumberStringBuilder::insert
          (NumberStringBuilder *this,int32_t index,UnicodeString *unistr,int32_t start,int32_t end,
          Field field,UErrorCode *status)

{
  char16_t cVar1;
  int32_t iVar2;
  ValueOrHeapArray<UNumberFormatFields> *pVVar3;
  ValueOrHeapArray<char16_t> *pVVar4;
  long lVar5;
  uint count;
  ulong uVar6;
  bool bVar7;
  
  count = end - start;
  iVar2 = prepareForInsert(this,index,count,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    lVar5 = (long)iVar2;
    uVar6 = 0;
    if (0 < (int)count) {
      uVar6 = (ulong)count;
    }
    while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
      cVar1 = UnicodeString::doCharAt(unistr,start);
      bVar7 = this->fUsingHeap == false;
      pVVar4 = (ValueOrHeapArray<char16_t> *)(this->fChars).heap.ptr;
      if (bVar7) {
        pVVar4 = &this->fChars;
      }
      pVVar4->value[lVar5] = cVar1;
      pVVar3 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
      if (bVar7) {
        pVVar3 = &this->fFields;
      }
      pVVar3->value[lVar5] = field;
      start = start + 1;
      lVar5 = lVar5 + 1;
    }
  }
  return count;
}

Assistant:

int32_t
NumberStringBuilder::insert(int32_t index, const UnicodeString &unistr, int32_t start, int32_t end,
                            Field field, UErrorCode &status) {
    int32_t count = end - start;
    int32_t position = prepareForInsert(index, count, status);
    if (U_FAILURE(status)) {
        return count;
    }
    for (int32_t i = 0; i < count; i++) {
        getCharPtr()[position + i] = unistr.charAt(start + i);
        getFieldPtr()[position + i] = field;
    }
    return count;
}